

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall
backend::codegen::RegAllocator::replace_read
          (RegAllocator *this,Reg *r,int i,optional<unsigned_int> pre_alloc_transient)

{
  bool bVar1;
  bool bVar2;
  Reg RVar3;
  ostream *poVar4;
  pointer ppVar5;
  pointer ppVar6;
  uint *puVar7;
  size_type sVar8;
  type pIVar9;
  pointer pIVar10;
  void *pvVar11;
  mapped_type *pmVar12;
  Timestamp *timestamp;
  ostream *poVar13;
  Function *function;
  Function *this_00;
  undefined4 in_EDX;
  Reg *in_RSI;
  long in_RDI;
  RegAllocator *in_stack_00000278;
  _Optional_payload_base<unsigned_int> in_stack_00000284;
  Interval in_stack_0000028c;
  mapped_type live_interval;
  add_pointer_t<arm::MemoryOperand> x__;
  LoadStoreInst *x_;
  value_type *x;
  Interval interval;
  int spill_pos;
  Reg rd;
  bool del;
  iterator spill_r;
  iterator reg_map_r;
  anon_class_8_2_9473111c disp_reg;
  pair<unsigned_int,_unsigned_int> *in_stack_fffffffffffff708;
  Function *in_stack_fffffffffffff710;
  Function *this_01;
  string *in_stack_fffffffffffff718;
  string *name;
  Function *in_stack_fffffffffffff720;
  RegAllocator *in_stack_fffffffffffff728;
  Function *in_stack_fffffffffffff738;
  RegAllocator *in_stack_fffffffffffff740;
  char *in_stack_fffffffffffff748;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  ConditionCode *in_stack_fffffffffffff770;
  MemoryOperand *in_stack_fffffffffffff778;
  uint *in_stack_fffffffffffff780;
  OpCode *in_stack_fffffffffffff788;
  Timestamp *in_stack_fffffffffffff798;
  ostream *in_stack_fffffffffffff7a0;
  Severity *in_stack_fffffffffffff808;
  ostream *in_stack_fffffffffffff810;
  long local_7c8;
  undefined1 local_721 [40];
  undefined1 local_6f9 [121];
  time_point_sys_clock local_680 [2];
  anon_class_8_2_9473111c *in_stack_fffffffffffff990;
  allocator<char> local_629;
  string local_628 [39];
  undefined1 local_601 [121];
  time_point_sys_clock local_588;
  Timestamp local_580 [3];
  undefined1 local_532;
  allocator<char> local_531;
  string local_530 [39];
  allocator<char> local_509;
  string local_508 [120];
  time_point_sys_clock local_490;
  Timestamp local_488;
  ostream local_470 [55];
  undefined1 local_439;
  mapped_type local_430;
  mapped_type local_428;
  allocator<char> local_419;
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0 [120];
  time_point_sys_clock local_378;
  Timestamp local_370 [3];
  undefined1 local_321;
  Severity local_320 [52];
  undefined4 local_2ec;
  ostream local_2e8 [20];
  pair<unsigned_int,_unsigned_int> local_2d4 [8];
  add_pointer_t<arm::MemoryOperand> local_290;
  long local_288;
  reference local_280;
  undefined8 local_26c;
  undefined8 local_264;
  int local_25c;
  Reg local_258;
  byte local_251;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_250;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_248;
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [120];
  time_point_sys_clock local_198;
  Timestamp local_190 [3];
  undefined1 local_141;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_140;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_138;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [120];
  time_point_sys_clock local_88;
  Timestamp local_80 [3];
  undefined1 local_25;
  Reg local_24;
  undefined4 local_1c;
  Reg *local_18;
  
  local_24 = *in_RSI;
  local_1c = in_EDX;
  local_18 = in_RSI;
  RVar3 = get_collapse_reg(in_stack_fffffffffffff728,(Reg)((ulong)in_stack_fffffffffffff720 >> 0x20)
                          );
  *local_18 = RVar3;
  bVar1 = arm::is_virtual_register(*local_18);
  if (bVar1) {
    local_138._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)in_stack_fffffffffffff708,(key_type *)0x23ba90);
    local_140._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)in_stack_fffffffffffff708);
    bVar1 = std::__detail::operator!=(&local_138,&local_140);
    if (bVar1) {
      replace_read::anon_class_8_2_9473111c::operator()(in_stack_fffffffffffff990);
      local_141 = 0;
      AixLog::operator<<(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
      AixLog::Tag::Tag((Tag *)0x23bb18);
      AixLog::operator<<((ostream *)in_stack_fffffffffffff740,(Tag *)in_stack_fffffffffffff738);
      local_198.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_190,&local_198);
      AixLog::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                 (allocator<char> *)in_stack_fffffffffffff740);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                 (allocator<char> *)in_stack_fffffffffffff740);
      AixLog::Function::Function
                (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                 (string *)in_stack_fffffffffffff710,(size_t)in_stack_fffffffffffff708);
      poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
      poVar4 = std::operator<<(poVar4,"graph ");
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)0x23bc4e);
      pvVar11 = (void *)std::ostream::operator<<(poVar4,ppVar5->second);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      AixLog::Function::~Function(in_stack_fffffffffffff710);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
      AixLog::Timestamp::~Timestamp(local_190);
      AixLog::Tag::~Tag((Tag *)0x23bcd9);
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)0x23bce6);
      *local_18 = ppVar5->second;
    }
    else {
      local_248._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
           ::find((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                   *)in_stack_fffffffffffff708,(key_type *)0x23bdfc);
      local_250._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
           ::end((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                  *)in_stack_fffffffffffff708);
      bVar1 = std::__detail::operator!=(&local_248,&local_250);
      if (bVar1) {
        local_251 = 0;
        local_25c = get_or_alloc_spill_pos
                              (in_stack_fffffffffffff740,
                               (Reg)((ulong)in_stack_fffffffffffff738 >> 0x20));
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                               *)0x23be71);
        local_264 = CONCAT44((ppVar6->second).end,local_1c);
        std::
        unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
        ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                 *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->first);
        bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x23beb4);
        if (bVar1) {
          puVar7 = std::optional<unsigned_int>::value
                             ((optional<unsigned_int> *)in_stack_fffffffffffff710);
          local_258 = *puVar7;
        }
        else {
          local_26c = local_264;
          std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                    ((optional<unsigned_int> *)in_stack_fffffffffffff710,
                     &in_stack_fffffffffffff708->first);
          local_258 = alloc_transient_reg(in_stack_00000278,in_stack_0000028c,
                                          (optional<unsigned_int>)in_stack_00000284);
        }
        sVar8 = std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)(in_RDI + 0x328));
        if (sVar8 != 0) {
          local_280 = std::
                      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      ::back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                              *)in_stack_fffffffffffff710);
          pIVar9 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                             ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                              in_stack_fffffffffffff710);
          if (pIVar9 == (type)0x0) {
            local_7c8 = 0;
          }
          else {
            local_7c8 = __dynamic_cast(pIVar9,&arm::Inst::typeinfo,&arm::LoadStoreInst::typeinfo,0);
          }
          local_288 = local_7c8;
          if (local_7c8 != 0) {
            local_290 = std::get_if<arm::MemoryOperand,std::__cxx11::string,arm::MemoryOperand>
                                  ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                    *)0x23bfd5);
            bVar1 = false;
            if ((*(int *)(local_288 + 8) == 0x1c) &&
               (bVar1 = false, *(Reg *)(local_288 + 0x10) == local_258)) {
              arm::MemoryOperand::MemoryOperand
                        ((MemoryOperand *)in_stack_fffffffffffff710,
                         (Reg)((ulong)in_stack_fffffffffffff708 >> 0x20),
                         (int16_t)((ulong)in_stack_fffffffffffff708 >> 0x10),
                         (MemoryAccessKind)((ulong)in_stack_fffffffffffff708 >> 8));
              bVar2 = arm::MemoryOperand::operator==
                                ((MemoryOperand *)in_stack_fffffffffffff728,
                                 (MemoryOperand *)in_stack_fffffffffffff720);
              bVar1 = false;
              if (bVar2) {
                pIVar10 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator->
                                    ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                                     0x23c089);
                bVar1 = pIVar10->cond == *(ConditionCode *)(in_RDI + 0x3ee);
              }
            }
            if (bVar1) {
              local_251 = 1;
            }
          }
        }
        if ((local_251 & 1) == 0) {
          local_2ec = 0x1a;
          in_stack_fffffffffffff808 = local_320;
          arm::MemoryOperand::MemoryOperand
                    ((MemoryOperand *)in_stack_fffffffffffff710,
                     (Reg)((ulong)in_stack_fffffffffffff708 >> 0x20),
                     (int16_t)((ulong)in_stack_fffffffffffff708 >> 0x10),
                     (MemoryAccessKind)((ulong)in_stack_fffffffffffff708 >> 8));
          in_stack_fffffffffffff810 = local_2e8;
          std::
          make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int&,arm::MemoryOperand,arm::ConditionCode&>
                    (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                     in_stack_fffffffffffff770);
          std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
          unique_ptr<arm::LoadStoreInst,std::default_delete<arm::LoadStoreInst>,void>
                    ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                     in_stack_fffffffffffff720,
                     (unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
                     in_stack_fffffffffffff718);
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_fffffffffffff710,(value_type *)in_stack_fffffffffffff708);
          std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                    ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                     in_stack_fffffffffffff720);
          std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
                    ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
                     in_stack_fffffffffffff710);
        }
        else {
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::pop_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      *)0x23c0db);
          std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                    (local_2d4,local_18,&local_258);
          std::optional<std::pair<unsigned_int,_unsigned_int>_>::
          optional<std::pair<unsigned_int,_unsigned_int>,_true>
                    ((optional<std::pair<unsigned_int,_unsigned_int>_> *)in_stack_fffffffffffff710,
                     in_stack_fffffffffffff708);
          std::optional<std::pair<unsigned_int,_unsigned_int>_>::operator=
                    ((optional<std::pair<unsigned_int,_unsigned_int>_> *)in_stack_fffffffffffff710,
                     (optional<std::pair<unsigned_int,_unsigned_int>_> *)in_stack_fffffffffffff708);
        }
        replace_read::anon_class_8_2_9473111c::operator()(in_stack_fffffffffffff990);
        local_321 = 0;
        AixLog::operator<<(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
        AixLog::Tag::Tag((Tag *)0x23c285);
        AixLog::operator<<((ostream *)in_stack_fffffffffffff740,(Tag *)in_stack_fffffffffffff738);
        local_378.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_370,&local_378);
        AixLog::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                   (allocator<char> *)in_stack_fffffffffffff740);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                   (allocator<char> *)in_stack_fffffffffffff740);
        AixLog::Function::Function
                  (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                   (string *)in_stack_fffffffffffff710,(size_t)in_stack_fffffffffffff708);
        poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
        poVar4 = std::operator<<(poVar4,"spill ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_25c);
        poVar4 = std::operator<<(poVar4,"with rd=");
        pvVar11 = (void *)std::ostream::operator<<(poVar4,local_258);
        std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
        AixLog::Function::~Function(in_stack_fffffffffffff710);
        std::__cxx11::string::~string(local_418);
        std::allocator<char>::~allocator(&local_419);
        std::__cxx11::string::~string(local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
        AixLog::Timestamp::~Timestamp(local_370);
        AixLog::Tag::~Tag((Tag *)0x23c479);
        *local_18 = local_258;
      }
      else {
        pmVar12 = std::
                  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                  ::at((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                        *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->first);
        local_430 = *pmVar12;
        local_428 = local_430;
        std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                  ((optional<unsigned_int> *)in_stack_fffffffffffff710,
                   &in_stack_fffffffffffff708->first);
        RVar3 = alloc_transient_reg(in_stack_00000278,in_stack_0000028c,
                                    (optional<unsigned_int>)in_stack_00000284);
        *local_18 = RVar3;
        replace_read::anon_class_8_2_9473111c::operator()(in_stack_fffffffffffff990);
        local_439 = 0;
        timestamp = (Timestamp *)
                    AixLog::operator<<(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
        poVar4 = local_470;
        AixLog::Tag::Tag((Tag *)0x23c632);
        AixLog::operator<<((ostream *)in_stack_fffffffffffff740,(Tag *)in_stack_fffffffffffff738);
        local_490.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(&local_488,&local_490);
        AixLog::operator<<(poVar4,timestamp);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                   (allocator<char> *)in_stack_fffffffffffff740);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                   (allocator<char> *)in_stack_fffffffffffff740);
        AixLog::Function::Function
                  (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                   (string *)in_stack_fffffffffffff710,(size_t)in_stack_fffffffffffff708);
        poVar13 = AixLog::operator<<((ostream *)in_stack_fffffffffffff740,in_stack_fffffffffffff738)
        ;
        std::operator<<(poVar13,"transient ");
        AixLog::Function::~Function(in_stack_fffffffffffff710);
        std::__cxx11::string::~string(local_530);
        std::allocator<char>::~allocator(&local_531);
        std::__cxx11::string::~string(local_508);
        std::allocator<char>::~allocator(&local_509);
        AixLog::Timestamp::~Timestamp(&local_488);
        AixLog::Tag::~Tag((Tag *)0x23c7a2);
        local_532 = 0;
        AixLog::operator<<(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
        AixLog::Tag::Tag((Tag *)0x23c7d5);
        AixLog::operator<<((ostream *)in_stack_fffffffffffff740,(Tag *)in_stack_fffffffffffff738);
        local_588.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_580,&local_588);
        AixLog::operator<<(poVar4,timestamp);
        this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_601;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,in_stack_fffffffffffff748,(allocator<char> *)in_stack_fffffffffffff740);
        __s = &local_629;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,(char *)__s,(allocator<char> *)in_stack_fffffffffffff740);
        AixLog::Function::Function
                  (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                   (string *)in_stack_fffffffffffff710,(size_t)in_stack_fffffffffffff708);
        poVar13 = AixLog::operator<<((ostream *)in_stack_fffffffffffff740,in_stack_fffffffffffff738)
        ;
        arm::display_reg_name(poVar13,(Reg)((ulong)in_stack_fffffffffffff738 >> 0x20));
        AixLog::Function::~Function(in_stack_fffffffffffff710);
        std::__cxx11::string::~string(local_628);
        std::allocator<char>::~allocator(&local_629);
        std::__cxx11::string::~string((string *)(local_601 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_601);
        AixLog::Timestamp::~Timestamp(local_580);
        AixLog::Tag::~Tag((Tag *)0x23c930);
        AixLog::operator<<(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
        AixLog::Tag::Tag((Tag *)0x23c963);
        function = (Function *)AixLog::operator<<(poVar13,(Tag *)in_stack_fffffffffffff738);
        local_680[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp((Timestamp *)(local_680 + 1),local_680);
        this_00 = (Function *)AixLog::operator<<(poVar4,timestamp);
        name = (string *)local_6f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,(char *)__s,(allocator<char> *)poVar13);
        this_01 = (Function *)local_721;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,(char *)__s,(allocator<char> *)poVar13);
        AixLog::Function::Function(this_00,name,(string *)this_01,(size_t)in_stack_fffffffffffff708)
        ;
        poVar4 = AixLog::operator<<(poVar13,function);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        AixLog::Function::~Function(this_01);
        std::__cxx11::string::~string((string *)(local_721 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_721);
        std::__cxx11::string::~string((string *)(local_6f9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_6f9);
        AixLog::Timestamp::~Timestamp((Timestamp *)(local_680 + 1));
        AixLog::Tag::~Tag((Tag *)0x23cab9);
      }
    }
  }
  else {
    replace_read::anon_class_8_2_9473111c::operator()(in_stack_fffffffffffff990);
    local_25 = 0;
    AixLog::operator<<(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    AixLog::Tag::Tag((Tag *)0x23b7ed);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff740,(Tag *)in_stack_fffffffffffff738);
    local_88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_80,&local_88);
    AixLog::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               (allocator<char> *)in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               (allocator<char> *)in_stack_fffffffffffff740);
    AixLog::Function::Function
              (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
               (string *)in_stack_fffffffffffff710,(size_t)in_stack_fffffffffffff708);
    poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    poVar4 = std::operator<<(poVar4,"phys");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff710);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    AixLog::Timestamp::~Timestamp(local_80);
    AixLog::Tag::~Tag((Tag *)0x23b987);
  }
  return;
}

Assistant:

void RegAllocator::replace_read(Reg &r, int i,
                                std::optional<Reg> pre_alloc_transient) {
  auto disp_reg = [r, i]() {
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << " at: " << i << " ";
  };
  r = get_collapse_reg(r);
  if (!is_virtual_register(r)) {
    disp_reg();
    LOG(TRACE) << "phys" << std::endl;
    return;
  } else if (auto reg_map_r = reg_map.find(r); reg_map_r != reg_map.end()) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph " << reg_map_r->second << std::endl;
    r = reg_map_r->second;
    return;
  } else if (auto spill_r = spilled_regs.find(r);
             spill_r != spilled_regs.end()) {
    // this register is allocated in stack
    bool del = false;

    Reg rd;
    auto spill_pos = get_or_alloc_spill_pos(r);
    auto interval = spill_r->second;
    interval.start = i;
    spilled_regs.erase(r);
    if (pre_alloc_transient) {
      rd = pre_alloc_transient.value();
    } else {
      rd = alloc_transient_reg(interval, r);
    }

    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x_->rd == rd &&
            (*x__) == MemoryOperand(REG_SP, spill_pos + stack_offset) &&
            x->cond == cur_cond) {
          del = true;
        }
      }
    }
    if (del) {
      inst_sink.pop_back();
      delayed_store = {{r, rd}};
    } else {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::LdR, rd, MemoryOperand(REG_SP, spill_pos + stack_offset),
          cur_cond));
    }
    disp_reg();
    LOG(TRACE) << "spill " << spill_pos << "with rd=" << rd << std::endl;
    r = rd;
    return;
  } else {
    // is temporary register
    auto live_interval = live_intervals.at(r);
    r = alloc_transient_reg(live_interval, r);
    disp_reg();
    LOG(TRACE) << "transient ";
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << std::endl;
    return;
  }
}